

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  long in_FS_OFFSET;
  internal *local_d0;
  char *file_local;
  allocator<char> local_95;
  int local_94;
  undefined1 local_90 [4];
  int line_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string file_name;
  
  file_name.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_94 = (int)file;
  local_d0 = this;
  if (this == (internal *)0x0) {
    local_d0 = (internal *)0x1e948b;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,(char *)local_d0,&local_95);
  std::allocator<char>::~allocator(&local_95);
  if (local_94 < 0) {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,":"
                  );
  }
  else {
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,":"
                  );
    StreamableToString<int>((string *)local_90,&local_94);
    std::operator+(&local_50,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    std::operator+(__return_storage_ptr__,&local_50,":");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != file_name.field_2._8_8_) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}